

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitem.h
# Opt level: O0

void __thiscall depspawn::internal::Workitem::post(Workitem *this)

{
  Task *in_RDI;
  
  *(undefined2 *)((long)&(in_RDI->func_).super__Function_base._M_functor + 8) = 2;
  TaskPool::enqueue((TaskPool *)this,in_RDI);
  return;
}

Assistant:

void post() {
        status = Status_t::Ready;
#ifdef DEPSPAWN_USE_TBB
        if (EnqueueTasks) {
          tbb::task::enqueue((tbb::task&)*task);
        } else {
          master_task->spawn((tbb::task&)*task);
        }
#else
        TP->enqueue((AbstractRunner *)task);
#endif
      }